

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionparser.cpp
# Opt level: O2

void __thiscall
OptionParser::parseReportOption
          (OptionParser *this,Network *network,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *tokenList)

{
  bool bVar1;
  int iVar2;
  InputError *this_00;
  int iVar3;
  string *this_01;
  IndexOption option;
  string *psVar4;
  string local_98;
  undefined1 local_78 [8];
  string keyword;
  allocator local_31;
  
  psVar4 = (tokenList->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  iVar3 = (int)((ulong)((long)(tokenList->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)psVar4) >> 5);
  if (iVar3 < 2) {
    return;
  }
  Utilities::upperCase((string *)local_78,psVar4);
  std::__cxx11::string::string((string *)(keyword.field_2._M_local_buf + 8),"PAGESIZE",&local_31);
  bVar1 = Utilities::match((string *)local_78,(string *)((long)&keyword.field_2 + 8));
  std::__cxx11::string::~string((string *)(keyword.field_2._M_local_buf + 8));
  if (bVar1) goto LAB_0013665b;
  std::__cxx11::string::string((string *)(keyword.field_2._M_local_buf + 8),"FILE",&local_31);
  bVar1 = Utilities::match((string *)local_78,(string *)((long)&keyword.field_2 + 8));
  std::__cxx11::string::~string((string *)(keyword.field_2._M_local_buf + 8));
  if (bVar1) {
    Options::setOption(&network->options,RPT_FILE_NAME,psVar4 + 1);
    goto LAB_0013665b;
  }
  iVar2 = Utilities::findFullMatch((string *)local_78,reportOptionKeywords);
  if (iVar2 < 0) {
    std::__cxx11::string::string((string *)(keyword.field_2._M_local_buf + 8),"NODES",&local_31);
    bVar1 = Utilities::match((string *)local_78,(string *)((long)&keyword.field_2 + 8));
    this_01 = (string *)(keyword.field_2._M_local_buf + 8);
    std::__cxx11::string::~string(this_01);
    iVar2 = 0;
    if (!bVar1) {
      std::__cxx11::string::string((string *)(keyword.field_2._M_local_buf + 8),"LINKS",&local_31);
      bVar1 = Utilities::match((string *)local_78,(string *)((long)&keyword.field_2 + 8));
      this_01 = (string *)(keyword.field_2._M_local_buf + 8);
      std::__cxx11::string::~string(this_01);
      if (!bVar1) {
        parseReportField((OptionParser *)this_01,network,iVar3,psVar4);
        goto LAB_0013665b;
      }
      iVar2 = 1;
    }
    parseReportItems((OptionParser *)this_01,iVar2,network,iVar3,psVar4);
    goto LAB_0013665b;
  }
  option = iVar2 + REPORT_SUMMARY;
  if (option == REPORT_STATUS) {
    std::__cxx11::string::string((string *)(keyword.field_2._M_local_buf + 8),"FULL",&local_31);
    bVar1 = Utilities::match(psVar4 + 1,(string *)((long)&keyword.field_2 + 8));
    std::__cxx11::string::~string((string *)(keyword.field_2._M_local_buf + 8));
    if (!bVar1) goto LAB_00136557;
    iVar3 = 1;
    Options::setOption(&network->options,REPORT_TRIALS,1);
    option = REPORT_STATUS;
  }
  else {
LAB_00136557:
    std::__cxx11::string::string((string *)(keyword.field_2._M_local_buf + 8),"YES",&local_31);
    psVar4 = psVar4 + 1;
    bVar1 = Utilities::match(psVar4,(string *)((long)&keyword.field_2 + 8));
    std::__cxx11::string::~string((string *)(keyword.field_2._M_local_buf + 8));
    if (bVar1) {
      iVar3 = 1;
    }
    else {
      std::__cxx11::string::string((string *)(keyword.field_2._M_local_buf + 8),"NO",&local_31);
      bVar1 = Utilities::match(psVar4,(string *)((long)&keyword.field_2 + 8));
      std::__cxx11::string::~string((string *)(keyword.field_2._M_local_buf + 8));
      iVar3 = 0;
      if (!bVar1) {
        this_00 = (InputError *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string((string *)&local_98,(string *)psVar4);
        InputError::InputError(this_00,3,&local_98);
        __cxa_throw(this_00,&InputError::typeinfo,ENerror::~ENerror);
      }
    }
  }
  Options::setOption(&network->options,option,iVar3);
LAB_0013665b:
  std::__cxx11::string::~string((string *)local_78);
  return;
}

Assistant:

void OptionParser::parseReportOption(Network* network, vector<string>& tokenList)
{
    // ... check for no data
    int nTokens = tokenList.size();
    if ( nTokens < 2 ) return;
    string* tokens = &tokenList[0];
    string keyword = Utilities::upperCase(tokens[0]);

    // ... PAGESIZE is deprecated
    if ( Utilities::match(keyword, "PAGESIZE") ) return;

    // ... check if option is name of report file
    if ( Utilities::match(keyword, "FILE") )
    {
        network->options.setOption(Options::RPT_FILE_NAME, tokens[1]);
        return;
    }

    // ... check for report types options
    int value;
    int option = Utilities::findFullMatch(keyword, reportOptionKeywords);
    if ( option >= 0 )
    {
        option = Options::REPORT_SUMMARY + option;

        // ... convert EPANET 2 "STATUS FULL" option to "TRIALS  YES" option
        if ( option == Options::REPORT_STATUS && Utilities::match(tokens[1], "FULL") )
        {
            network->options.setOption(Options::REPORT_TRIALS, true);
            network->options.setOption(Options::REPORT_STATUS, true);
            return;
        }

        if ( Utilities::match(tokens[1], "YES") ) value = true;
        else if ( Utilities::match(tokens[1], "NO") ) value = false;
        else throw InputError(InputError::INVALID_KEYWORD, tokens[1]);
        network->options.setOption((Options::IndexOption)option, value);
        return;
    }

    // ... parse which nodes & links are reported on
    if ( Utilities::match(keyword, "NODES") )
    {
        parseReportItems(Element::NODE, network, nTokens, tokens);
    }
    else if ( Utilities::match(keyword, "LINKS") )
    {
        parseReportItems(Element::LINK, network, nTokens, tokens);
    }

    // ... parse report field options
    else parseReportField(network, nTokens, tokens);
}